

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::SetPlotQuery(ImPlotLimits *query,ImPlotYAxis y_axis)

{
  float fVar1;
  float fVar2;
  ImPlotPlot *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_28;
  float fStack_24;
  
  if (3 < y_axis + 1U) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xad4,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
  }
  pIVar3 = GImPlot->CurrentPlot;
  if (pIVar3 != (ImPlotPlot *)0x0) {
    if (y_axis < 0) {
      y_axis = pIVar3->CurrentYAxis;
    }
    UpdateTransformCache();
    IVar4 = PlotToPixels((query->X).Min,(query->Y).Min,y_axis);
    IVar5 = PlotToPixels((query->X).Max,(query->Y).Max,y_axis);
    fVar6 = IVar5.x;
    fVar7 = IVar5.y;
    pIVar3->Querying = false;
    pIVar3->Queried = true;
    local_28 = IVar4.x;
    fStack_24 = IVar4.y;
    fVar8 = local_28;
    if (fVar6 <= local_28) {
      fVar8 = fVar6;
    }
    fVar9 = fStack_24;
    if (fVar7 <= fStack_24) {
      fVar9 = fVar7;
    }
    fVar1 = (pIVar3->PlotRect).Min.x;
    fVar2 = (pIVar3->PlotRect).Min.y;
    (pIVar3->QueryRect).Min.x = fVar8 - fVar1;
    (pIVar3->QueryRect).Min.y = fVar9 - fVar2;
    (pIVar3->QueryRect).Max.x =
         (float)(~-(uint)(fVar6 <= local_28) & (uint)fVar6 |
                (uint)local_28 & -(uint)(fVar6 <= local_28)) - fVar1;
    (pIVar3->QueryRect).Max.y =
         (float)(~-(uint)(fVar7 <= fStack_24) & (uint)fVar7 |
                (uint)fStack_24 & -(uint)(fVar7 <= fStack_24)) - fVar2;
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xad5,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
}

Assistant:

void SetPlotQuery(const ImPlotLimits& query, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    UpdateTransformCache();
    ImVec2 p1 = PlotToPixels(query.Min(),y_axis);
    ImVec2 p2 = PlotToPixels(query.Max(),y_axis);
    plot.Queried = true;
    plot.Querying = false;
    plot.QueryRect = ImRect(ImMin(p1,p2)-plot.PlotRect.Min, ImMax(p1,p2)-plot.PlotRect.Min);
}